

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Quaternion<double,_0>,_std::allocator<Eigen::Quaternion<double,_0>_>_>
                   *q,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  R;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_60;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_48;
  
  local_a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *(long *)(q + 8);
  lVar3 = *(long *)q;
  uVar1 = lVar2 - lVar3 >> 5;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::resize(&local_a8,uVar1 & 0xffffffff);
  if ((int)((ulong)(lVar2 - lVar3) >> 5) != 0) {
    uVar1 = uVar1 & 0xffffffff;
    lVar3 = 0;
    lVar2 = 0;
    do {
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 ((long)((local_a8.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                        m_data.array + lVar3),
                 (RotationBase<Eigen::Quaternion<double,_0>,_3> *)(*(long *)q + lVar2));
      lVar2 = lVar2 + 0x20;
      lVar3 = lVar3 + 0x48;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector(&local_48,&local_a8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_60,P);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,theta_d);
  std::vector<double,_std::allocator<double>_>::vector(&local_90,theta_dd);
  getTau(__return_storage_ptr__,this,G,&local_48,&local_60,&local_78,&local_90);
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Quaterniond> q, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    vector<Eigen::Matrix3d> R;
    unsigned int len = q.size();
    R.resize(len);
    for (int i = 0; i < len; i++)
    {
        R[i] = q[i];
    }
    return getTau(G, R, P, theta_d, theta_dd);
}